

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_che.c
# Opt level: O1

err_t beltCHEUnwrap(void *dest,void *src1,size_t count1,void *src2,size_t count2,octet *mac,
                   octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  size_t size;
  blob_t state;
  err_t eVar2;
  belt_che_st *st;
  
  eVar2 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(src1,count1);
    if (bVar1 != 0) {
      bVar1 = memIsValid(src2,count2);
      if (bVar1 != 0) {
        bVar1 = memIsValid(mac,8);
        if (bVar1 != 0) {
          bVar1 = memIsValid(key,len);
          if (bVar1 != 0) {
            bVar1 = memIsValid(iv,0x10);
            if (bVar1 != 0) {
              bVar1 = memIsValid(dest,count1);
              if (bVar1 != 0) {
                size = beltDWP_keep();
                state = blobCreate(size);
                if (state == (blob_t)0x0) {
                  eVar2 = 0x6e;
                }
                else {
                  beltCHEStart(state,key,len,iv);
                  beltCHEStepI(src2,count2,state);
                  beltCHEStepA(src1,count1,state);
                  beltCHEStepG_internal(state);
                  bVar1 = memEq(mac,(void *)((long)state + 0x50),8);
                  if (bVar1 == 0) {
                    eVar2 = 0x1ff;
                  }
                  else {
                    memMove(dest,src1,count1);
                    beltCHEStepE(dest,count1,state);
                    eVar2 = 0;
                  }
                  blobClose(state);
                }
              }
            }
          }
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t beltCHEUnwrap(void* dest, const void* src1, size_t count1,
	const void* src2, size_t count2, const octet mac[8], const octet key[],
	size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (len != 16 && len != 24 && len != 32 ||
		!memIsValid(src1, count1) ||
		!memIsValid(src2, count2) ||
		!memIsValid(mac, 8) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count1))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltDWP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// снять защиту
	beltCHEStart(state, key, len, iv);
	beltCHEStepI(src2, count2, state);
	beltCHEStepA(src1, count1, state);
	if (!beltCHEStepV(mac, state))
	{
		blobClose(state);
		return ERR_BAD_MAC;
	}
	memMove(dest, src1, count1);
	beltCHEStepD(dest, count1, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}